

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O0

map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
* __thiscall
adios2::core::engine::InlineReader::DoAllStepsBlocksInfo
          (InlineReader *this,Variable<signed_char> *variable)

{
  int iVar1;
  map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
  *in_RDI;
  ScopedTimer __var2196;
  void *in_stack_ffffffffffffffb8;
  map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
  *this_00;
  
  this_00 = in_RDI;
  if (DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::__var196 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::
                                 __var196);
    if (iVar1 != 0) {
      DoAllStepsBlocksInfo::__var196 = (void *)ps_timer_create_("InlineReader::AllStepsBlockInfo");
      in_stack_ffffffffffffffb8 = DoAllStepsBlocksInfo::__var196;
      __cxa_guard_release(&DoAllStepsBlocksInfo(adios2::core::Variable<signed>const&)::__var196);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)this_00,in_stack_ffffffffffffffb8);
  memset(this_00,0,0x30);
  std::
  map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<signed_char>::BPInfo,_std::allocator<adios2::core::Variable<signed_char>::BPInfo>_>_>_>_>
         *)0xaae4df);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)this_00);
  return in_RDI;
}

Assistant:

void InlineReader::Init()
{
    InitParameters();
    InitTransports();
}